

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O2

_Bool hashmap_scan(hashmap *map,_func__Bool_void_ptr_void_ptr *iter,void *udata)

{
  ulong uVar1;
  _Bool _Var2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  for (uVar4 = 0; uVar1 = map->nbuckets, uVar4 < uVar1; uVar4 = uVar4 + 1) {
    lVar3 = map->bucketsz * uVar4;
    if (*(short *)((long)map->buckets + lVar3 + 6) != 0) {
      _Var2 = (*iter)((void *)((long)map->buckets + lVar3 + 8),udata);
      if (!_Var2) break;
    }
  }
  return uVar1 <= uVar4;
}

Assistant:

bool hashmap_scan(struct hashmap *map, 
    bool (*iter)(const void *item, void *udata), void *udata)
{
    for (size_t i = 0; i < map->nbuckets; i++) {
        struct bucket *bucket = bucket_at(map, i);
        if (bucket->dib && !iter(bucket_item(bucket), udata)) {
            return false;
        }
    }
    return true;
}